

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O0

void __thiscall cmEventBasedConnection::WriteData(cmEventBasedConnection *this,string *_data)

{
  void *__dest;
  bool bVar1;
  int iVar2;
  uv_stream_s *puVar3;
  pointer pcVar4;
  ulong __n;
  uv_write_t *req_00;
  char *base;
  void *__src;
  uv_buf_t uVar5;
  write_req_t *req;
  size_type ds;
  string local_40 [8];
  string data;
  uv_thread_t curr_thread_id;
  string *_data_local;
  cmEventBasedConnection *this_local;
  
  data.field_2._8_8_ = uv_thread_self();
  if ((this->super_cmConnection).Server == (cmServerBase *)0x0) {
    __assert_fail("this->Server",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmConnection.cxx"
                  ,0x4a,"virtual void cmEventBasedConnection::WriteData(const std::string &)");
  }
  iVar2 = uv_thread_equal((uv_thread_t *)(data.field_2._M_local_buf + 8),
                          &((this->super_cmConnection).Server)->ServeThreadId);
  if (iVar2 == 0) {
    __assert_fail("uv_thread_equal(&curr_thread_id, &this->Server->ServeThreadId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmConnection.cxx"
                  ,0x4b,"virtual void cmEventBasedConnection::WriteData(const std::string &)");
  }
  std::__cxx11::string::string(local_40,(string *)_data);
  puVar3 = ::cm::uv_handle_ptr_base_<uv_stream_s>::get
                     (&(this->WriteStream).super_uv_handle_ptr_base_<uv_stream_s>);
  if (puVar3 == (uv_stream_s *)0x0) {
    __assert_fail("this->WriteStream.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmConnection.cxx"
                  ,0x4f,"virtual void cmEventBasedConnection::WriteData(const std::string &)");
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->BufferStrategy);
  if (bVar1) {
    pcVar4 = std::
             unique_ptr<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
             ::operator->(&this->BufferStrategy);
    (*pcVar4->_vptr_cmConnectionBufferStrategy[3])(&ds,pcVar4,local_40);
    std::__cxx11::string::operator=(local_40,(string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  __n = std::__cxx11::string::size();
  req_00 = (uv_write_t *)operator_new(0xd0);
  req_00->data = this;
  base = (char *)operator_new__(__n);
  req._0_4_ = (uint)__n;
  uVar5 = uv_buf_init(base,(uint)req);
  *(uv_buf_t *)(req_00 + 1) = uVar5;
  __dest = req_00[1].data;
  __src = (void *)std::__cxx11::string::c_str();
  memcpy(__dest,__src,__n);
  puVar3 = ::cm::uv_handle_ptr_::operator_cast_to_uv_stream_s_((uv_handle_ptr_ *)&this->WriteStream)
  ;
  uv_write(req_00,puVar3,(uv_buf_t *)(req_00 + 1),1,on_write);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmEventBasedConnection::WriteData(const std::string& _data)
{
#ifndef NDEBUG
  auto curr_thread_id = uv_thread_self();
  assert(this->Server);
  assert(uv_thread_equal(&curr_thread_id, &this->Server->ServeThreadId));
#endif

  auto data = _data;
  assert(this->WriteStream.get());
  if (BufferStrategy) {
    data = BufferStrategy->BufferOutMessage(data);
  }

  auto ds = data.size();

  write_req_t* req = new write_req_t;
  req->req.data = this;
  req->buf = uv_buf_init(new char[ds], static_cast<unsigned int>(ds));
  memcpy(req->buf.base, data.c_str(), ds);
  uv_write(reinterpret_cast<uv_write_t*>(req), this->WriteStream, &req->buf, 1,
           on_write);
}